

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cryptor.cpp
# Opt level: O0

unique_ptr<Cryptor,_std::default_delete<Cryptor>_> __thiscall
Cryptor::cryptor_factory(Cryptor *this,string *mode,string *type,string *message)

{
  bool bVar1;
  runtime_error *prVar2;
  char *pcVar3;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg_1;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> msg;
  Cryptors c_type;
  bool b_mode;
  string *message_local;
  string *type_local;
  string *mode_local;
  
  bVar1 = std::operator==(mode,"-e");
  if (bVar1) {
    msg.field_2._M_local_buf[0xf] = '\x01';
  }
  else {
    bVar1 = std::operator==(mode,"-d");
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "Not possible mode: ",mode);
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::runtime_error::runtime_error(prVar2,pcVar3);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    msg.field_2._M_local_buf[0xf] = '\0';
  }
  bVar1 = std::operator==(type,"Huffman");
  if (bVar1) {
    msg.field_2._8_4_ = 0;
  }
  else {
    bVar1 = std::operator==(type,"Lz77");
    if (bVar1) {
      msg.field_2._8_4_ = 1;
    }
    else {
      bVar1 = std::operator==(type,"Deflate");
      if (!bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,"Not possible type: ",type);
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        std::runtime_error::runtime_error(prVar2,pcVar3);
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      msg.field_2._8_4_ = 2;
    }
  }
  cryptor_factory(this,(bool)(msg.field_2._M_local_buf[0xf] & 1),msg.field_2._8_4_,message);
  return (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)
         (__uniq_ptr_data<Cryptor,_std::default_delete<Cryptor>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Cryptor> Cryptor::cryptor_factory(
  const std::string& mode,
  const std::string& type,
  const std::string& message)
{
  bool b_mode;
  Cryptors c_type;

  if (mode == ENCRYPT_KEY) {
    b_mode = true;
  }
  else if (mode == DECRYPT_KEY) {
    b_mode = false;
  }
  else {
    const auto msg = "Not possible mode: " + mode;
    throw runtime_error(msg.c_str());
  }

  if (type == HUFFMAN_KEY) {
    c_type = Cryptors::Huffman;
  }
  else if (type == LZ77_KEY) {
    c_type = Cryptors::Lz77;
  }
  else if (type == DEFLATE_KEY) {
    c_type = Cryptors::Deflate;
  }
  else {
    const auto msg = "Not possible type: " + type;
    throw runtime_error(msg.c_str());
  }

  return cryptor_factory(b_mode, c_type, message);
}